

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_posix.c
# Opt level: O1

char * ethash_io_create_filename(char *dirname,char *filename,size_t filename_length)

{
  char cVar1;
  size_t sVar2;
  char *dest;
  size_t __size;
  
  sVar2 = strlen(dirname);
  cVar1 = dirname[sVar2];
  __size = ((sVar2 + filename_length) - (ulong)(cVar1 == '/')) + 2;
  dest = (char *)malloc(__size);
  if (dest == (char *)0x0) {
    dest = (char *)0x0;
  }
  else {
    *dest = '\0';
    ethash_strncat(dest,__size,dirname,sVar2);
    if (cVar1 != '/') {
      sVar2 = strlen(dest);
      if (sVar2 + 2 <= __size) {
        sVar2 = strlen(dest);
        (dest + sVar2)[0] = '/';
        (dest + sVar2)[1] = '\0';
      }
    }
    ethash_strncat(dest,__size,filename,filename_length);
  }
  return dest;
}

Assistant:

char* ethash_io_create_filename(
	char const* dirname,
	char const* filename,
	size_t filename_length
)
{
	size_t dirlen = strlen(dirname);
	size_t dest_size = dirlen + filename_length + 1;
	if (dirname[dirlen] != '/') {
		dest_size += 1;
	}
	char* name = malloc(dest_size);
	if (!name) {
		return NULL;
	}

	name[0] = '\0';
	ethash_strncat(name, dest_size, dirname, dirlen);
	if (dirname[dirlen] != '/') {
		ethash_strncat(name, dest_size, "/", 1);
	}
	ethash_strncat(name, dest_size, filename, filename_length);
	return name;
}